

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O1

void __thiscall
hungarian_algorithm::HungarianSolver<double,_unsigned_long,_std::less<double>_>::
subtractSmallestUncoveredElement(HungarianSolver<double,_unsigned_long,_std::less<double>_> *this)

{
  long lVar1;
  ulong *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  logic_error *this_00;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  pointer pdVar13;
  size_t col;
  ulong uVar14;
  double dVar15;
  double dVar16;
  long local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  dVar15 = this->zero_cost_;
  if (*(ulong *)this == 0) {
    bVar7 = false;
  }
  else {
    uVar9 = *(ulong *)&this->field_0x8;
    pdVar13 = (this->cost_matrix_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar10 = 0;
    bVar7 = false;
    do {
      uVar14 = uVar10 + 0x3f;
      if (-1 < (long)uVar10) {
        uVar14 = uVar10;
      }
      if ((*(ulong *)(*(long *)&this->field_0x10 + ((long)uVar14 >> 6) * 8 + -8 +
                     (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
           (uVar10 & 0x3f) & 1) == 0 && uVar9 != 0) {
        uVar14 = 0;
        dVar16 = dVar15;
        do {
          uVar8 = uVar14 + 0x3f;
          if (-1 < (long)uVar14) {
            uVar8 = uVar14;
          }
          dVar15 = dVar16;
          if ((*(ulong *)(*(long *)&this->field_0x38 + ((long)uVar8 >> 6) * 8 + -8 +
                         (ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
               (uVar14 & 0x3f) & 1) == 0) {
            if (bVar7) {
              dVar15 = pdVar13[uVar14];
              if (dVar16 <= pdVar13[uVar14]) {
                dVar15 = dVar16;
              }
            }
            else {
              bVar7 = true;
              dVar15 = pdVar13[uVar14];
            }
          }
          uVar14 = uVar14 + 1;
          dVar16 = dVar15;
        } while (uVar9 != uVar14);
      }
      uVar10 = uVar10 + 1;
      pdVar13 = pdVar13 + uVar9;
    } while (uVar10 != *(ulong *)this);
  }
  if (!bVar7) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Hungarian algorithm: !found_minimum; this should never happen",""
              );
    std::logic_error::logic_error(this_00,(string *)local_50);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if (*(long *)this != 0) {
    lVar4 = *(long *)&this->field_0x10;
    uVar9 = 0;
    local_70 = 0;
    do {
      if (*(long *)&this->field_0x8 != 0) {
        uVar10 = uVar9 + 0x3f;
        if (-1 < (long)uVar9) {
          uVar10 = uVar9;
        }
        lVar5 = *(long *)&this->field_0x38;
        lVar6 = *(long *)&this->field_0x60;
        pdVar13 = (this->cost_matrix_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar14 = 0;
        do {
          uVar8 = local_70 + uVar14;
          uVar11 = *(ulong *)(lVar4 + ((long)uVar10 >> 6) * 8 +
                             (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8) &
                   1L << ((byte)uVar9 & 0x3f);
          if (uVar11 == 0) {
LAB_0011dbb9:
            uVar11 = uVar14 + 0x3f;
            if (-1 < (long)uVar14) {
              uVar11 = uVar14;
            }
            if ((*(ulong *)(lVar5 + ((long)uVar11 >> 6) * 8 + -8 +
                           (ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar14 & 0x3f) & 1) == 0) {
              dVar16 = pdVar13[local_70 + uVar14] - dVar15;
              uVar11 = uVar8 + 0x3f;
              if (-1 < (long)uVar8) {
                uVar11 = uVar8;
              }
              pdVar13[local_70 + uVar14] = dVar16;
LAB_0011dc1e:
              uVar12 = 1L << ((byte)uVar8 & 0x3f);
              lVar1 = lVar6 + ((long)uVar11 >> 6) * 8;
              lVar3 = (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8;
              if ((dVar16 != this->zero_cost_) || (NAN(dVar16) || NAN(this->zero_cost_))) {
                puVar2 = (ulong *)(lVar1 + lVar3);
                *puVar2 = *puVar2 & ~uVar12;
              }
              else {
                puVar2 = (ulong *)(lVar1 + lVar3);
                *puVar2 = *puVar2 | uVar12;
              }
            }
          }
          else {
            uVar12 = uVar14 + 0x3f;
            if (-1 < (long)uVar14) {
              uVar12 = uVar14;
            }
            if ((*(ulong *)(lVar5 + ((long)uVar12 >> 6) * 8 + -8 +
                           (ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                 (uVar14 & 0x3f) & 1) != 0) {
              dVar16 = pdVar13[local_70 + uVar14] + dVar15;
              uVar11 = uVar8 + 0x3f;
              if (-1 < (long)uVar8) {
                uVar11 = uVar8;
              }
              pdVar13[local_70 + uVar14] = dVar16;
              goto LAB_0011dc1e;
            }
            if (uVar11 == 0) goto LAB_0011dbb9;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < *(ulong *)&this->field_0x8);
        local_70 = local_70 + uVar14;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < *(ulong *)this);
  }
  return;
}

Assistant:

void subtractSmallestUncoveredElement()
  {
    // Find smallest uncovered element:
    bool found_minimum = false;
    Cost h = zero_cost_;
    for (std::size_t row = 0; row < num_rows_; ++row)
    {
      if (!covered_rows_[row])
      {
        for (std::size_t col = 0; col < num_cols_; ++col)
        {
          if (!covered_cols_[col])
          {
            if (!found_minimum)
            {
              h = cost_matrix_[getIndex(row, col)];
              found_minimum = true;
            }
            else
            {
              h = std::min(h, cost_matrix_[getIndex(row, col)]);
            }
          }
        }
      }
    }

    if (!found_minimum)
    {
      throw std::logic_error("Hungarian algorithm: !found_minimum; this should never happen");
    }

    // Subtract h from each uncovered element, and add h to each doubly covered element:
    std::size_t i = 0;
    for (std::size_t row = 0; row < num_rows_; ++row)
    {
      for (std::size_t col = 0; col < num_cols_; ++col, ++i)
      {
        if (covered_rows_[row] && covered_cols_[col])
        {
          cost_matrix_[i] += h;
          zero_matrix_[i] = (cost_matrix_[i] == zero_cost_);
        }
        else if (!covered_rows_[row] && !covered_cols_[col])
        {
          cost_matrix_[i] -= h;
          zero_matrix_[i] = (cost_matrix_[i] == zero_cost_);
        }
      }
    }
  }